

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

ListReader * __thiscall
capnp::_::OrphanBuilder::asListReader
          (ListReader *__return_storage_ptr__,OrphanBuilder *this,ElementSize elementSize)

{
  SegmentBuilder **ppSVar1;
  ushort uVar2;
  ushort uVar3;
  CapTableReader *pCVar4;
  word *pwVar5;
  Arena *pAVar6;
  ReadLimiter *pRVar7;
  ulong uVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar11;
  SegmentBuilder **ppSVar12;
  CapTableBuilder **ppCVar13;
  uint uVar14;
  SegmentBuilder *pSVar15;
  ulong uVar16;
  ElementSize EVar17;
  uint uVar18;
  long lVar19;
  char *pcVar20;
  ulong uVar21;
  char *pcVar22;
  uint uVar23;
  char *params;
  Fault f;
  SegmentBuilder *pSVar10;
  
  uVar14 = (uint)(this->tag).content;
  if (*(int *)((long)&(this->tag).content + 4) != 0 || uVar14 != 0) {
    pSVar10 = this->segment;
    pCVar4 = &this->capTable->super_CapTableReader;
    ppSVar12 = (SegmentBuilder **)this->location;
    if (pSVar10 == (SegmentBuilder *)0x0) {
      pSVar10 = (SegmentBuilder *)0x0;
LAB_002905e3:
      if (ppSVar12 == (SegmentBuilder **)0x0) goto LAB_0029080a;
LAB_002905ef:
      uVar14 = (uint)(this->tag).content;
LAB_002905f3:
      if ((uVar14 & 3) == 1) {
        uVar14 = *(uint *)((long)&(this->tag).content + 4);
        EVar17 = (ElementSize)uVar14 & INLINE_COMPOSITE;
        if (EVar17 == INLINE_COMPOSITE) {
          uVar14 = uVar14 >> 3;
          if (pSVar10 == (SegmentBuilder *)0x0) {
LAB_00290651:
            if ((*(uint *)ppSVar12 & 3) == 0) {
              uVar18 = *(uint *)ppSVar12 >> 2 & 0x1fffffff;
              uVar16 = (ulong)uVar18;
              uVar2 = *(ushort *)((long)ppSVar12 + 4);
              uVar3 = *(ushort *)((long)ppSVar12 + 6);
              uVar23 = (uint)uVar3 + (uint)uVar2;
              if (uVar23 * uVar16 < (ulong)uVar14 || uVar23 * uVar16 - (ulong)uVar14 == 0) {
                pSVar15 = (SegmentBuilder *)0x0;
                if (uVar23 != 0) {
                  pSVar15 = pSVar10;
                }
                if ((pSVar10 != (SegmentBuilder *)0x0) && (uVar23 == 0)) {
                  pRVar7 = (pSVar10->super_SegmentReader).readLimiter;
                  uVar11 = pRVar7->limit;
                  if (uVar11 < uVar16) {
                    (*((pSVar10->super_SegmentReader).arena)->_vptr_Arena[3])();
                    pcVar20 = "amplifiedRead(segment, size * (ONE * WORDS / ELEMENTS))";
                    iVar9 = 0x8f2;
                    goto LAB_00290b9b;
                  }
                  pRVar7->limit = uVar11 - uVar16;
                  pSVar15 = pSVar10;
                }
                ppCVar13 = (CapTableBuilder **)(ppSVar12 + 1);
                if (elementSize - 2 < 4) {
                  if (uVar2 == 0) {
                    params = "Expected a primitive list, but got a list of pointer-only structs.";
                    pcVar20 = "tag->structRef.dataSize.get() > ZERO * WORDS";
                    pcVar22 = 
                    "\"Expected a primitive list, but got a list of pointer-only structs.\"";
                    iVar9 = 0x90f;
                    goto LAB_002908ec;
                  }
                }
                else if (elementSize == POINTER) {
                  if (uVar3 == 0) {
                    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[62]>
                              (&f,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                               ,0x91a,FAILED,"tag->structRef.ptrCount.get() > ZERO * POINTERS",
                               "\"Expected a pointer list, but got a list of data-only structs.\"",
                               (char (*) [62])
                               "Expected a pointer list, but got a list of data-only structs.");
                    goto LAB_00290802;
                  }
                  ppCVar13 = ppCVar13 + uVar2;
                }
                else if (elementSize == BIT) {
                  pcVar22 = 
                  "Found struct list where bit list was expected; upgrading boolean lists to structs is no longer supported."
                  ;
                  pcVar20 = 
                  "\"Found struct list where bit list was expected; upgrading boolean lists to structs \" \"is no longer supported.\""
                  ;
                  iVar9 = 0x905;
                  goto LAB_002907f8;
                }
                __return_storage_ptr__->segment = &pSVar15->super_SegmentReader;
                __return_storage_ptr__->capTable = pCVar4;
                __return_storage_ptr__->ptr = (byte *)ppCVar13;
                __return_storage_ptr__->elementCount = uVar18;
                __return_storage_ptr__->step = uVar23 * 0x40;
                __return_storage_ptr__->structDataSize = (uint)uVar2 << 6;
                __return_storage_ptr__->structPointerCount = uVar3;
                __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
LAB_002908a7:
                iVar9 = 0x7ffffffe;
                goto LAB_002908ac;
              }
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[57]>
                        (&f,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x8ea,FAILED,"upgradeBound<uint64_t>(size) * wordsPerElement <= wordCount"
                         ,"\"INLINE_COMPOSITE list\'s elements overrun its word count.\"",
                         (char (*) [57])"INLINE_COMPOSITE list\'s elements overrun its word count.")
              ;
            }
            else {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[61]>
                        (&f,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x8e2,FAILED,"tag->kind() == WirePointer::STRUCT",
                         "\"INLINE_COMPOSITE lists of non-STRUCT type are not supported.\"",
                         (char (*) [61])
                         "INLINE_COMPOSITE lists of non-STRUCT type are not supported.");
            }
          }
          else {
            if (((long)ppSVar12 - (long)(pSVar10->super_SegmentReader).ptr.ptr >> 3) + (ulong)uVar14
                + 1 <= (pSVar10->super_SegmentReader).ptr.size_) {
              uVar16 = (ulong)uVar14 + 1;
              pRVar7 = (pSVar10->super_SegmentReader).readLimiter;
              uVar11 = pRVar7->limit;
              if (uVar16 <= uVar11) {
                pRVar7->limit = uVar11 - uVar16;
                goto LAB_00290651;
              }
              (*((pSVar10->super_SegmentReader).arena)->_vptr_Arena[3])();
            }
            pcVar20 = "boundsCheck(segment, ptr, wordCount + POINTER_SIZE_IN_WORDS)";
            iVar9 = 0x8db;
LAB_00290ab2:
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[45]>
                      (&f,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                       ,iVar9,FAILED,pcVar20,"\"Message contains out-of-bounds list pointer.\"",
                       (char (*) [45])"Message contains out-of-bounds list pointer.");
          }
        }
        else {
          uVar18 = *(uint *)(BITS_PER_ELEMENT_TABLE + ((ulong)uVar14 & 7) * 4);
          uVar16 = (ulong)(uVar14 >> 3);
          uVar23 = (uint)(EVar17 == POINTER) * 0x40 + uVar18;
          if (pSVar10 != (SegmentBuilder *)0x0) {
            uVar11 = uVar23 * uVar16 + 0x3f >> 6 & 0xffffffff;
            if (((long)ppSVar12 - (long)(pSVar10->super_SegmentReader).ptr.ptr >> 3) + uVar11 <=
                (pSVar10->super_SegmentReader).ptr.size_) {
              pAVar6 = (pSVar10->super_SegmentReader).arena;
              pRVar7 = (pSVar10->super_SegmentReader).readLimiter;
              if (uVar11 <= pRVar7->limit) {
                pRVar7->limit = pRVar7->limit - uVar11;
                if ((uVar14 & 7) != 0) goto LAB_002907c6;
                if (uVar16 <= pRVar7->limit) {
                  pRVar7->limit = pRVar7->limit - uVar16;
                  goto LAB_00290827;
                }
                (*pAVar6->_vptr_Arena[3])();
                pcVar20 = "amplifiedRead(segment, elementCount * (ONE * WORDS / ELEMENTS))";
                iVar9 = 0x93c;
LAB_00290b9b:
                kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[41]>
                          (&f,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                           ,iVar9,FAILED,pcVar20,"\"Message contains amplified list pointer.\"",
                           (char (*) [41])"Message contains amplified list pointer.");
                goto LAB_00290802;
              }
              (*pAVar6->_vptr_Arena[3])();
            }
            pcVar20 = "boundsCheck(segment, ptr, wordCount)";
            iVar9 = 0x934;
            goto LAB_00290ab2;
          }
          if ((uVar14 & 7) != 0) {
LAB_002907c6:
            if ((elementSize != BIT) && (EVar17 == BIT)) {
              pcVar22 = 
              "Found bit list where struct list was expected; upgrading boolean lists to structs is no longer supported."
              ;
              pcVar20 = 
              "\"Found bit list where struct list was expected; upgrading boolean lists to structs \" \"is no longer supported.\""
              ;
              iVar9 = 0x945;
LAB_002907f8:
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[106]>
                        (&f,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                         ,iVar9,FAILED,(char *)0x0,pcVar20,(char (*) [106])pcVar22);
              goto LAB_00290802;
            }
          }
LAB_00290827:
          if (uVar18 < *(uint *)(BITS_PER_ELEMENT_TABLE + (ulong)elementSize * 4)) {
            pcVar20 = "expectedDataBitsPerElement <= dataSize";
            iVar9 = 0x955;
          }
          else {
            if ((elementSize != POINTER) || (EVar17 == POINTER)) {
              __return_storage_ptr__->segment = &pSVar10->super_SegmentReader;
              __return_storage_ptr__->capTable = pCVar4;
              __return_storage_ptr__->ptr = (byte *)ppSVar12;
              __return_storage_ptr__->elementCount = uVar14 >> 3;
              __return_storage_ptr__->step = uVar23;
              __return_storage_ptr__->structDataSize = uVar18;
              __return_storage_ptr__->structPointerCount = (ushort)(EVar17 == POINTER);
              __return_storage_ptr__->elementSize = EVar17;
              goto LAB_002908a7;
            }
            pcVar20 = "expectedPointersPerElement <= pointerCount";
            iVar9 = 0x959;
          }
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[55]>
                    (&f,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,iVar9,FAILED,pcVar20,
                     "\"Message contained list with incompatible element type.\"",
                     (char (*) [55])"Message contained list with incompatible element type.");
        }
      }
      else {
        params = "Message contains non-list pointer where list pointer was expected.";
        pcVar20 = "ref->kind() == WirePointer::LIST";
        pcVar22 = "\"Message contains non-list pointer where list pointer was expected.\"";
        iVar9 = 0x8cf;
LAB_002908ec:
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[67]>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,iVar9,FAILED,pcVar20,pcVar22,(char (*) [67])params);
      }
    }
    else {
      if ((uVar14 & 3) != 2) goto LAB_002905e3;
      iVar9 = (*((pSVar10->super_SegmentReader).arena)->_vptr_Arena[2])();
      pSVar10 = (SegmentBuilder *)CONCAT44(extraout_var,iVar9);
      if (pSVar10 != (SegmentBuilder *)0x0) {
        uVar16 = (pSVar10->super_SegmentReader).ptr.size_;
        uVar14 = (uint)(this->tag).content;
        uVar11 = (ulong)(uVar14 >> 3);
        if ((long)uVar16 < (long)(ulong)(uVar14 >> 3)) {
          uVar11 = uVar16;
        }
        uVar21 = 2 - (ulong)((uVar14 & 4) == 0);
        if (uVar16 < uVar11 + uVar21) {
LAB_002909a9:
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[44]>
                    (&f,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x23c,FAILED,"boundsCheck(segment, ptr, padWords)",
                     "\"Message contains out-of-bounds far pointer.\"",
                     (char (*) [44])"Message contains out-of-bounds far pointer.");
          goto LAB_00290802;
        }
        pwVar5 = (pSVar10->super_SegmentReader).ptr.ptr;
        pAVar6 = (pSVar10->super_SegmentReader).arena;
        pRVar7 = (pSVar10->super_SegmentReader).readLimiter;
        uVar8 = pRVar7->limit;
        if (uVar8 < uVar21) {
          (*pAVar6->_vptr_Arena[3])();
          goto LAB_002909a9;
        }
        this = (OrphanBuilder *)(pwVar5 + uVar11);
        ppSVar1 = &this->segment;
        pRVar7->limit = uVar8 - uVar21;
        if ((uVar14 & 4) != 0) {
          iVar9 = (*pAVar6->_vptr_Arena[2])(pAVar6,(ulong)*(uint *)((long)&(this->tag).content + 4))
          ;
          pSVar10 = (SegmentBuilder *)CONCAT44(extraout_var_00,iVar9);
          if (pSVar10 == (SegmentBuilder *)0x0) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[56]>
                      (&f,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x24e,FAILED,"newSegment != nullptr",
                       "\"Message contains double-far pointer to unknown segment.\"",
                       (char (*) [56])"Message contains double-far pointer to unknown segment.");
          }
          else {
            uVar14 = (uint)(this->tag).content;
            if ((uVar14 & 3) == 2) {
              uVar11 = (ulong)(uVar14 >> 3);
              uVar16 = (pSVar10->super_SegmentReader).ptr.size_;
              if ((long)uVar16 < (long)uVar11) {
                uVar11 = uVar16;
              }
              ppSVar12 = (SegmentBuilder **)((pSVar10->super_SegmentReader).ptr.ptr + uVar11);
              this = (OrphanBuilder *)ppSVar1;
              goto LAB_002905e3;
            }
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51]>
                      (&f,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x252,FAILED,"pad->kind() == WirePointer::FAR",
                       "\"Second word of double-far pad must be far pointer.\"",
                       (char (*) [51])"Second word of double-far pad must be far pointer.");
          }
          goto LAB_00290802;
        }
        uVar14 = (uint)(this->tag).content;
        lVar19 = (long)((int)uVar14 >> 2);
        ppSVar12 = (SegmentBuilder **)(pwVar5 + uVar16);
        if ((lVar19 < (long)pwVar5 - (long)ppSVar1 >> 3) ||
           ((long)ppSVar12 - (long)ppSVar1 >> 3 < lVar19)) goto LAB_002905ef;
        ppSVar12 = ppSVar1 + lVar19;
        goto LAB_002905f3;
      }
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49]>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x234,FAILED,"segment != nullptr",
                 "\"Message contains far pointer to unknown segment.\"",
                 (char (*) [49])"Message contains far pointer to unknown segment.");
    }
LAB_00290802:
    kj::_::Debug::Fault::~Fault(&f);
  }
LAB_0029080a:
  __return_storage_ptr__->ptr = (byte *)0x0;
  __return_storage_ptr__->elementCount = 0;
  __return_storage_ptr__->step = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->step + 2) = 0;
  __return_storage_ptr__->segment = (SegmentReader *)0x0;
  __return_storage_ptr__->capTable = (CapTableReader *)0x0;
  __return_storage_ptr__->elementSize = elementSize;
  iVar9 = 0x7fffffff;
LAB_002908ac:
  __return_storage_ptr__->nestingLimit = iVar9;
  return __return_storage_ptr__;
}

Assistant:

ListReader OrphanBuilder::asListReader(ElementSize elementSize) const {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));
  return WireHelpers::readListPointer(
      segment, capTable, tagAsPtr(), location, nullptr, elementSize, kj::maxValue);
}